

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O0

bool __thiscall
Diligent::DearchiverBase::PSOData<Diligent::RayTracingPipelineStateCreateInfo>::Deserialize
          (PSOData<Diligent::RayTracingPipelineStateCreateInfo> *this,char *Name,
          Serializer<(Diligent::SerializerMode)0> *Ser)

{
  bool bVar1;
  Serializer<(Diligent::SerializerMode)0> *Ser_local;
  char *Name_local;
  PSOData<Diligent::RayTracingPipelineStateCreateInfo> *this_local;
  
  (this->CreateInfo).super_PipelineStateCreateInfo.PSODesc.super_DeviceObjectAttribs.Name = Name;
  bVar1 = DeserializeInternal(this,Ser);
  if (bVar1) {
    bVar1 = PSOSerializer<(Diligent::SerializerMode)0>::SerializeAuxData
                      (Ser,&this->AuxData,&this->Allocator);
    if (bVar1) {
      operator|=(&(this->CreateInfo).super_PipelineStateCreateInfo.Flags,
                 PSO_CREATE_FLAG_DONT_REMAP_SHADER_RESOURCES);
      if (((this->AuxData).NoShaderReflection & 1U) != 0) {
        operator|=(&(this->InternalCI).Flags,PSO_CREATE_INTERNAL_FLAG_LAST);
      }
      (this->CreateInfo).super_PipelineStateCreateInfo.pInternalData = &this->InternalCI;
      if ((this->CreateInfo).super_PipelineStateCreateInfo.ResourceSignaturesCount == 0) {
        (this->CreateInfo).super_PipelineStateCreateInfo.ResourceSignaturesCount = 1;
        operator|=(&(this->InternalCI).Flags,PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DearchiverBase::PSOData<CreateInfoType>::Deserialize(const char* Name, Serializer<SerializerMode::Read>& Ser)
{
    CreateInfo.PSODesc.Name = Name;

    if (!DeserializeInternal(Ser))
        return false;

    if (!PSOSerializer<SerializerMode::Read>::SerializeAuxData(Ser, AuxData, &Allocator))
        return false;

    CreateInfo.Flags |= PSO_CREATE_FLAG_DONT_REMAP_SHADER_RESOURCES;
    if (AuxData.NoShaderReflection)
        InternalCI.Flags |= PSO_CREATE_INTERNAL_FLAG_NO_SHADER_REFLECTION;

    CreateInfo.pInternalData = &InternalCI;

    if (CreateInfo.ResourceSignaturesCount == 0)
    {
        CreateInfo.ResourceSignaturesCount = 1;
        InternalCI.Flags |= PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0;
    }

    return true;
}